

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dropCell(MemPage *pPage,int idx,int sz,int *pRC)

{
  u8 *puVar1;
  uint uVar2;
  int iVar3;
  u8 *__dest;
  int hdr;
  int rc;
  u8 *ptr;
  u8 *data;
  u32 pc;
  int *pRC_local;
  int sz_local;
  int idx_local;
  MemPage *pPage_local;
  
  if (*pRC == 0) {
    puVar1 = pPage->aData;
    __dest = pPage->aCellIdx + (idx << 1);
    uVar2 = (uint)pPage->hdrOffset;
    if (pPage->pBt->usableSize < (uint)CONCAT11(*__dest,__dest[1]) + sz) {
      iVar3 = sqlite3CorruptError(0x1109c);
      *pRC = iVar3;
    }
    else {
      iVar3 = freeSpace(pPage,CONCAT11(*__dest,__dest[1]),(u16)sz);
      if (iVar3 == 0) {
        pPage->nCell = pPage->nCell - 1;
        if (pPage->nCell == 0) {
          memset(puVar1 + (int)(uVar2 + 1),0,4);
          puVar1[(int)(uVar2 + 7)] = '\0';
          puVar1[(int)(uVar2 + 5)] = (u8)(pPage->pBt->usableSize >> 8);
          puVar1[(long)(int)(uVar2 + 5) + 1] = (u8)pPage->pBt->usableSize;
          pPage->nFree = ((pPage->pBt->usableSize - (uint)pPage->hdrOffset) -
                         (uint)pPage->childPtrSize) + -8;
        }
        else {
          memmove(__dest,__dest + 2,(long)(int)(((uint)pPage->nCell - idx) * 2));
          puVar1[(int)(uVar2 + 3)] = (u8)(pPage->nCell >> 8);
          puVar1[(long)(int)(uVar2 + 3) + 1] = (u8)pPage->nCell;
          pPage->nFree = pPage->nFree + 2;
        }
      }
      else {
        *pRC = iVar3;
      }
    }
  }
  return;
}

Assistant:

static void dropCell(MemPage *pPage, int idx, int sz, int *pRC){
  u32 pc;         /* Offset to cell content of cell being deleted */
  u8 *data;       /* pPage->aData */
  u8 *ptr;        /* Used to move bytes around within data[] */
  int rc;         /* The return code */
  int hdr;        /* Beginning of the header.  0 most pages.  100 page 1 */

  if( *pRC ) return;
  assert( idx>=0 && idx<pPage->nCell );
  assert( CORRUPT_DB || sz==cellSize(pPage, idx) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->nFree>=0 );
  data = pPage->aData;
  ptr = &pPage->aCellIdx[2*idx];
  pc = get2byte(ptr);
  hdr = pPage->hdrOffset;
  testcase( pc==get2byte(&data[hdr+5]) );
  testcase( pc+sz==pPage->pBt->usableSize );
  if( pc+sz > pPage->pBt->usableSize ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  rc = freeSpace(pPage, pc, sz);
  if( rc ){
    *pRC = rc;
    return;
  }
  pPage->nCell--;
  if( pPage->nCell==0 ){
    memset(&data[hdr+1], 0, 4);
    data[hdr+7] = 0;
    put2byte(&data[hdr+5], pPage->pBt->usableSize);
    pPage->nFree = pPage->pBt->usableSize - pPage->hdrOffset
                       - pPage->childPtrSize - 8;
  }else{
    memmove(ptr, ptr+2, 2*(pPage->nCell - idx));
    put2byte(&data[hdr+3], pPage->nCell);
    pPage->nFree += 2;
  }
}